

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O3

void __thiscall
duckdb::HashJoinGlobalSinkState::ScheduleFinalize
          (HashJoinGlobalSinkState *this,Pipeline *pipeline,Event *event)

{
  idx_t iVar1;
  pointer pJVar2;
  pointer this_00;
  idx_t *piVar3;
  HashJoinTableInitEvent *this_01;
  shared_ptr<duckdb::HashJoinFinalizeEvent,_true> new_finalize_event;
  shared_ptr<duckdb::HashJoinTableInitEvent,_true> new_init_event;
  undefined1 local_79;
  shared_ptr<duckdb::HashJoinFinalizeEvent,_true> local_78;
  shared_ptr<duckdb::HashJoinTableInitEvent,_true> local_68;
  shared_ptr<duckdb::Event,_true> local_58;
  shared_ptr<duckdb::HashJoinFinalizeEvent> local_48;
  shared_ptr<duckdb::Event,_true> local_38;
  
  pJVar2 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator->(&this->hash_table);
  this_00 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator->(&pJVar2->data_collection);
  piVar3 = TupleDataCollection::Count(this_00);
  iVar1 = *piVar3;
  pJVar2 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator->(&this->hash_table);
  if (iVar1 == 0) {
    pJVar2->finalized = true;
  }
  else {
    JoinHashTable::AllocatePointerTable(pJVar2);
    local_48.super___shared_ptr<duckdb::HashJoinFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::HashJoinTableInitEvent,std::allocator<duckdb::HashJoinTableInitEvent>,duckdb::Pipeline&,duckdb::HashJoinGlobalSinkState&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_48.
                super___shared_ptr<duckdb::HashJoinFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(HashJoinTableInitEvent **)&local_48,
               (allocator<duckdb::HashJoinTableInitEvent> *)&local_78,pipeline,this);
    shared_ptr<duckdb::HashJoinTableInitEvent,_true>::shared_ptr
              (&local_68,(shared_ptr<duckdb::HashJoinTableInitEvent> *)&local_48);
    if (local_48.super___shared_ptr<duckdb::HashJoinFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_48.
                 super___shared_ptr<duckdb::HashJoinFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_68.internal.
         super___shared_ptr<duckdb::HashJoinTableInitEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_68.internal.
            super___shared_ptr<duckdb::HashJoinTableInitEvent,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    if (local_68.internal.
        super___shared_ptr<duckdb::HashJoinTableInitEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_68.internal.
         super___shared_ptr<duckdb::HashJoinTableInitEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_68.internal.
              super___shared_ptr<duckdb::HashJoinTableInitEvent,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_68.internal.
         super___shared_ptr<duckdb::HashJoinTableInitEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_68.internal.
              super___shared_ptr<duckdb::HashJoinTableInitEvent,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    Event::InsertEvent(event,&local_58);
    if (local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_48.super___shared_ptr<duckdb::HashJoinFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::HashJoinFinalizeEvent,std::allocator<duckdb::HashJoinFinalizeEvent>,duckdb::Pipeline&,duckdb::HashJoinGlobalSinkState&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_48.
                super___shared_ptr<duckdb::HashJoinFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(HashJoinFinalizeEvent **)&local_48,
               (allocator<duckdb::HashJoinFinalizeEvent> *)&local_79,pipeline,this);
    shared_ptr<duckdb::HashJoinFinalizeEvent,_true>::shared_ptr(&local_78,&local_48);
    if (local_48.super___shared_ptr<duckdb::HashJoinFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_48.
                 super___shared_ptr<duckdb::HashJoinFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    this_01 = shared_ptr<duckdb::HashJoinTableInitEvent,_true>::operator->(&local_68);
    local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_78.internal.
         super___shared_ptr<duckdb::HashJoinFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_78.internal.
            super___shared_ptr<duckdb::HashJoinFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    local_78.internal.super___shared_ptr<duckdb::HashJoinFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_78.internal.super___shared_ptr<duckdb::HashJoinFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Event::InsertEvent((Event *)this_01,&local_38);
    if (local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_78.internal.
        super___shared_ptr<duckdb::HashJoinFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_78.internal.
                 super___shared_ptr<duckdb::HashJoinFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_68.internal.
        super___shared_ptr<duckdb::HashJoinTableInitEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_68.internal.
                 super___shared_ptr<duckdb::HashJoinTableInitEvent,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void HashJoinGlobalSinkState::ScheduleFinalize(Pipeline &pipeline, Event &event) {
	if (hash_table->Count() == 0) {
		hash_table->finalized = true;
		return;
	}
	hash_table->AllocatePointerTable();

	auto new_init_event = make_shared_ptr<HashJoinTableInitEvent>(pipeline, *this);
	event.InsertEvent(new_init_event);

	auto new_finalize_event = make_shared_ptr<HashJoinFinalizeEvent>(pipeline, *this);
	new_init_event->InsertEvent(std::move(new_finalize_event));
}